

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relay.cpp
# Opt level: O0

void __thiscall TCPRelayHandler::HandleEvent(TCPRelayHandler *this,SOCKET s,int event)

{
  bool bVar1;
  Log *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint local_18;
  SOCKET local_14;
  int event_local;
  SOCKET s_local;
  TCPRelayHandler *this_local;
  
  local_18 = event;
  local_14 = s;
  _event_local = this;
  if (s == this->remote_socket_) {
    if ((event & 8U) != 0) {
      OnRemoteError(this);
    }
    bVar1 = IsDestroyed(this);
    if ((!bVar1) && ((local_18 & 0x11) != 0)) {
      OnRemoteRead(this);
    }
    bVar1 = IsDestroyed(this);
    if ((!bVar1) && ((local_18 & 4) != 0)) {
      OnRemoteWrite(this);
    }
  }
  else if (s == this->local_socket_) {
    if ((event & 8U) != 0) {
      OnLocalError(this);
    }
    bVar1 = IsDestroyed(this);
    if ((!bVar1) && ((local_18 & 0x11) != 0)) {
      OnLocalRead(this);
    }
    bVar1 = IsDestroyed(this);
    if ((!bVar1) && ((local_18 & 4) != 0)) {
      OnLocalWrite(this);
    }
  }
  else {
    pLVar2 = Log::GetInstance();
    pLVar2 = Log::operator<<(pLVar2,yellow);
    Log::FormatTime_abi_cxx11_();
    pLVar2 = Log::operator<<(pLVar2,&local_38);
    pLVar2 = Log::operator<<(pLVar2,(char (*) [12])" [warning] ");
    Log::operator<<(pLVar2,(char (*) [16])"unknown socket\n");
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = IsDestroyed(this);
  if ((bVar1) && (this != (TCPRelayHandler *)0x0)) {
    (*(this->super_IDNSNotify)._vptr_IDNSNotify[1])();
  }
  return;
}

Assistant:

void TCPRelayHandler::HandleEvent(SOCKET s, int event)
{
    // order is important
    if (s == remote_socket_)
    {
        if (event & kPollErr)
        {
            OnRemoteError();
        }
        if (!IsDestroyed() &&
                (event & (kPollIn | kPollHup)))
        {
            OnRemoteRead();
        }
        if (!IsDestroyed() && (event & kPollOut))
        {
            OnRemoteWrite();
        }
    }
    else if (s == local_socket_)
    {
        if (event & kPollErr)
        {
            OnLocalError();
        }
        if (!IsDestroyed() &&
                (event & (kPollIn | kPollHup)))
        {
            OnLocalRead();
        }
        if (!IsDestroyed() && (event & kPollOut))
        {
            OnLocalWrite();
        }
    }
    else
        LOGW << "unknown socket\n";
    if (IsDestroyed())
    {
        //free memory when it mark destroyed
        delete this;
    }
}